

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

int mg_vprintf(mg_connection *conn,char *fmt,__va_list_tag *ap)

{
  uint uVar1;
  char *__s;
  int len;
  size_t size;
  size_t __size;
  char local_2058 [8];
  void *pvStack_2050;
  void *local_2048;
  char mem [8192];
  
  local_2048 = ap->reg_save_area;
  local_2058 = *(char (*) [8])ap;
  pvStack_2050 = ap->overflow_arg_area;
  uVar1 = vsnprintf((char *)0x0,0,fmt,local_2058);
  if ((int)uVar1 < 0) {
    local_2048 = ap->reg_save_area;
    local_2058 = *(char (*) [8])ap;
    pvStack_2050 = ap->overflow_arg_area;
    uVar1 = 0xffffffff;
    __size = 0x800;
    __s = (char *)0x0;
    while ((int)uVar1 < 0) {
      free(__s);
      __size = __size * 4;
      __s = (char *)malloc(__size);
      if (__s == (char *)0x0) {
        __s = (char *)0x0;
        break;
      }
      mem._16_8_ = local_2048;
      mem[0] = local_2058[0];
      mem[1] = local_2058[1];
      mem[2] = local_2058[2];
      mem[3] = local_2058[3];
      mem[4] = local_2058[4];
      mem[5] = local_2058[5];
      mem[6] = local_2058[6];
      mem[7] = local_2058[7];
      mem._8_8_ = pvStack_2050;
      uVar1 = vsnprintf(__s,__size - 1,fmt,mem);
      __s[__size - 1] = '\0';
    }
LAB_0010db38:
    if (0 < (int)uVar1) goto LAB_0010db3c;
  }
  else {
    if (uVar1 < 0x2000) {
      local_2048 = ap->reg_save_area;
      local_2058 = *(char (*) [8])ap;
      pvStack_2050 = ap->overflow_arg_area;
      __s = mem;
      vsnprintf(__s,0x2000,fmt,local_2058);
      goto LAB_0010db38;
    }
    __s = (char *)malloc((ulong)(uVar1 + 1));
    if (__s == (char *)0x0) {
      uVar1 = 0xffffffff;
      __s = (char *)0x0;
      goto LAB_0010db55;
    }
    local_2048 = ap->reg_save_area;
    local_2058 = *(char (*) [8])ap;
    pvStack_2050 = ap->overflow_arg_area;
    vsnprintf(__s,(ulong)(uVar1 + 1),fmt,local_2058);
LAB_0010db3c:
    uVar1 = mg_write(conn,__s,(ulong)uVar1);
  }
  if (__s == mem) {
    return uVar1;
  }
LAB_0010db55:
  free(__s);
  return uVar1;
}

Assistant:

static int
mg_vprintf(struct mg_connection *conn, const char *fmt, va_list ap)
{
	char mem[MG_BUF_LEN];
	char *buf = NULL;
	int len;

	if ((len = alloc_vprintf(&buf, mem, sizeof(mem), fmt, ap)) > 0) {
		len = mg_write(conn, buf, (size_t)len);
	}
	if (buf != mem) {
		mg_free(buf);
	}

	return len;
}